

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O1

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CCompExp *exp)

{
  IExpression *pIVar1;
  mapped_type *__rhs;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pIVar1 = (exp->leftOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 != (IExpression *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  }
  __rhs = std::
          map<enums::TCompareOperation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<enums::TCompareOperation>,_std::allocator<std::pair<const_enums::TCompareOperation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&CCompExp::stringOperations_abi_cxx11_,&exp->operation);
  std::operator+(&local_40," ",__rhs);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&this->code,(ulong)local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pIVar1 = (exp->rightOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar1 != (IExpression *)0x0) {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  }
  return;
}

Assistant:

void CConvertVisitor::Visit(CCompExp &exp) {
	if (exp.leftOperand) {
		exp.leftOperand->Accept(*this);
	}
	this->code += " " + exp.stringOperations[exp.operation] + " ";
	if (exp.rightOperand) {
		exp.rightOperand->Accept(*this);
	}
}